

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

uint __thiscall
Js::JavascriptStackWalker::GetLoopNumber(JavascriptStackWalker *this,bool *usedInternalFrameInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CallInfo CVar4;
  uint uVar5;
  
  if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
    CVar4 = GetCallInfo(this,false);
    if (-1 < CVar4._0_4_) {
      return 0xffffffff;
    }
    if (this->tempInterpreterFrame == (InterpreterStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x1a0,"(this->tempInterpreterFrame)","this->tempInterpreterFrame"
                                 );
      if (!bVar2) goto LAB_00afb520;
      *puVar3 = 0;
    }
    uVar5 = *(uint *)(this->tempInterpreterFrame + 0xcc);
    if (uVar5 != 0xffffffff) {
      bVar2 = false;
      goto LAB_00afb510;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x1a2,"(loopNum != LoopHeader::NoLoop)",
                                "loopNum != LoopHeader::NoLoop");
    if (!bVar2) goto LAB_00afb520;
    bVar2 = false;
  }
  else {
    if ((this->lastInternalFrameInfo).frameType != InternalFrameType_LoopBody) {
      return 0xffffffff;
    }
    if (this->interpreterFrame == (InterpreterStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x195,"(this->interpreterFrame)","this->interpreterFrame");
      if (!bVar2) goto LAB_00afb520;
      *puVar3 = 0;
    }
    uVar5 = *(uint *)(this->interpreterFrame + 0xcc);
    bVar2 = true;
    if (uVar5 != 0xffffffff) goto LAB_00afb510;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x197,"(loopNum != LoopHeader::NoLoop)",
                                "loopNum != LoopHeader::NoLoop");
    if (!bVar2) {
LAB_00afb520:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar2 = true;
  }
  *puVar3 = 0;
LAB_00afb510:
  *usedInternalFrameInfo = bVar2;
  return uVar5;
}

Assistant:

uint JavascriptStackWalker::GetLoopNumber(bool& usedInternalFrameInfo) const
    {
        uint loopNum = LoopHeader::NoLoop;
        if (this->lastInternalFrameInfo.codeAddress != nullptr)
        {
            if (this->lastInternalFrameInfo.frameType == InternalFrameType_LoopBody)
            {
                AnalysisAssert(this->interpreterFrame);
                loopNum = this->interpreterFrame->GetCurrentLoopNum();
                Assert(loopNum != LoopHeader::NoLoop);
                usedInternalFrameInfo = true;
            }
        }
        else
        {
            if (this->IsCurrentPhysicalFrameForLoopBody())
            {
                // Internal frame but codeAddress on lastInternalFrameInfo not set. We must be in an inlined frame in the loop body.
                Assert(this->tempInterpreterFrame);
                loopNum = this->tempInterpreterFrame->GetCurrentLoopNum();
                Assert(loopNum != LoopHeader::NoLoop);
                usedInternalFrameInfo = false;
            }
        }

        return loopNum;
    }